

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::removeTarget(CommonCore *this,InterfaceHandle handle,string_view targetToRemove)

{
  byte bVar1;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var2;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  size_t size;
  action_t newAction;
  string_view message;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  Time TStack_b8;
  Time local_b0;
  Time TStack_a8;
  Time local_a0;
  SmallBuffer SStack_98;
  pointer pbStack_38;
  pointer local_30;
  pointer pbStack_28;
  
  size = targetToRemove._M_len;
  p_Var2 = getHandleInfo(this,handle);
  if (p_Var2 == (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "invalid handle";
    message._M_len = 0xe;
    InvalidIdentifier::InvalidIdentifier(this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  SStack_98.heap = local_d8 + 0x40;
  local_d8._0_4_ = cmd_ignore;
  local_d8._4_4_ = 0;
  local_c8._0_4_ = 0;
  local_c8._4_4_ = -1700000000;
  local_c0._0_2_ = 0;
  local_c0._2_2_ = 0;
  local_c0._4_4_ = 0;
  TStack_b8.internalTimeCode = 0;
  local_b0.internalTimeCode = 0;
  TStack_a8.internalTimeCode = 0;
  local_a0.internalTimeCode = 0;
  SStack_98.buffer._M_elems[0] = 0;
  SStack_98.buffer._M_elems[1] = 0;
  SStack_98.buffer._M_elems[2] = 0;
  SStack_98.buffer._M_elems[3] = 0;
  SStack_98.buffer._M_elems[4] = 0;
  SStack_98.buffer._M_elems[5] = 0;
  SStack_98.buffer._M_elems[6] = 0;
  SStack_98.buffer._M_elems[7] = 0;
  SStack_98.buffer._M_elems[8] = 0;
  SStack_98.buffer._M_elems[9] = 0;
  SStack_98.buffer._M_elems[10] = 0;
  SStack_98.buffer._M_elems[0xb] = 0;
  SStack_98.buffer._M_elems[0xc] = 0;
  SStack_98.buffer._M_elems[0xd] = 0;
  SStack_98.buffer._M_elems[0xe] = 0;
  SStack_98.buffer._M_elems[0xf] = 0;
  SStack_98.buffer._M_elems[0x10] = 0;
  SStack_98.buffer._M_elems[0x11] = 0;
  SStack_98.buffer._M_elems[0x12] = 0;
  SStack_98.buffer._M_elems[0x13] = 0;
  SStack_98.buffer._M_elems[0x14] = 0;
  SStack_98.buffer._M_elems[0x15] = 0;
  SStack_98.buffer._M_elems[0x16] = 0;
  SStack_98.buffer._M_elems[0x17] = 0;
  SStack_98.buffer._M_elems[0x18] = 0;
  SStack_98.buffer._M_elems[0x19] = 0;
  SStack_98.buffer._M_elems[0x1a] = 0;
  SStack_98.buffer._M_elems[0x1b] = 0;
  SStack_98.buffer._M_elems[0x1c] = 0;
  SStack_98.buffer._M_elems[0x1d] = 0;
  SStack_98.buffer._M_elems[0x1e] = 0;
  SStack_98.buffer._M_elems[0x1f] = 0;
  SStack_98.buffer._M_elems[0x20] = 0;
  SStack_98.buffer._M_elems[0x21] = 0;
  SStack_98.buffer._M_elems[0x22] = 0;
  SStack_98.buffer._M_elems[0x23] = 0;
  SStack_98.buffer._M_elems[0x24] = 0;
  SStack_98.buffer._M_elems[0x25] = 0;
  SStack_98.buffer._M_elems[0x26] = 0;
  SStack_98.buffer._M_elems[0x27] = 0;
  SStack_98.buffer._M_elems[0x28] = 0;
  SStack_98.buffer._M_elems[0x29] = 0;
  SStack_98.buffer._M_elems[0x2a] = 0;
  SStack_98.buffer._M_elems[0x2b] = 0;
  SStack_98.buffer._M_elems[0x2c] = 0;
  SStack_98.buffer._M_elems[0x2d] = 0;
  SStack_98.buffer._M_elems[0x2e] = 0;
  SStack_98.buffer._M_elems[0x2f] = 0;
  SStack_98.buffer._M_elems[0x30] = 0;
  SStack_98.buffer._M_elems[0x31] = 0;
  SStack_98.buffer._M_elems[0x32] = 0;
  SStack_98.buffer._M_elems[0x33] = 0;
  SStack_98.buffer._M_elems[0x34] = 0;
  SStack_98.buffer._M_elems[0x35] = 0;
  SStack_98.buffer._M_elems[0x36] = 0;
  SStack_98.buffer._M_elems[0x37] = 0;
  SStack_98.buffer._M_elems[0x38] = 0;
  SStack_98.buffer._M_elems[0x39] = 0;
  SStack_98.buffer._M_elems[0x3a] = 0;
  SStack_98.buffer._M_elems[0x3b] = 0;
  SStack_98.buffer._M_elems[0x3c] = 0;
  SStack_98.buffer._M_elems[0x3d] = 0;
  SStack_98.buffer._M_elems[0x3e] = 0;
  SStack_98.buffer._M_elems[0x3f] = 0;
  SStack_98.bufferSize = 0;
  SStack_98.bufferCapacity = 0x40;
  SStack_98.nonOwning = false;
  SStack_98.locked = false;
  SStack_98.usingAllocatedBuffer = false;
  SStack_98.errorCondition = '\0';
  SStack_98.userKey = 0;
  pbStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  pbStack_28 = (pointer)0x0;
  local_d8._8_8_ = (p_Var2->super__Hash_node_base)._M_nxt;
  if (((SmallBuffer *)SStack_98.heap != (SmallBuffer *)targetToRemove._M_str) &&
     (SmallBuffer::reserve((SmallBuffer *)SStack_98.heap,size), size != 0)) {
    SStack_98.bufferSize = size;
    memcpy(SStack_98.heap,(SmallBuffer *)targetToRemove._M_str,size);
    size = SStack_98.bufferSize;
  }
  SStack_98.bufferSize = size;
  this_00 = getFederateAt(this,(LocalFederateId)
                               *(BaseType *)
                                &(p_Var2->
                                 super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                                 ._M_storage._M_storage);
  if (this_00 != (FederateState *)0x0) {
    TStack_b8.internalTimeCode = (this_00->time_granted).internalTimeCode;
  }
  bVar1 = (p_Var2->
          super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
          ._M_storage._M_storage.__data[4];
  if (bVar1 < 0x69) {
    if (bVar1 == 0x65) {
      newAction = cmd_remove_named_filter;
    }
    else {
      if (bVar1 != 0x66) goto LAB_002a108c;
      newAction = cmd_remove_named_endpoint;
    }
LAB_002a105b:
    ActionMessage::setAction((ActionMessage *)local_d8,newAction);
  }
  else {
    if (bVar1 != 0x69) {
      newAction = cmd_remove_named_input;
      if (bVar1 != 0x70) goto LAB_002a108c;
      goto LAB_002a105b;
    }
    ActionMessage::setAction((ActionMessage *)local_d8,cmd_remove_named_publication);
    FederateState::addAction(this_00,(ActionMessage *)local_d8);
  }
  BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_d8);
LAB_002a108c:
  ActionMessage::~ActionMessage((ActionMessage *)local_d8);
  return;
}

Assistant:

void CommonCore::removeTarget(InterfaceHandle handle, std::string_view targetToRemove)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }

    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.name(targetToRemove);
    auto* fed = getFederateAt(handleInfo->local_fed_id);
    if (fed != nullptr) {
        cmd.actionTime = fed->grantedTime();
    }
    switch (handleInfo->handleType) {
        case InterfaceType::PUBLICATION:
            cmd.setAction(CMD_REMOVE_NAMED_INPUT);
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_REMOVE_NAMED_ENDPOINT);
            break;
        case InterfaceType::INPUT:
            cmd.setAction(CMD_REMOVE_NAMED_PUBLICATION);
            fed->addAction(cmd);
            break;
        case InterfaceType::ENDPOINT:
            cmd.setAction(CMD_REMOVE_NAMED_FILTER);
            break;
        default:
            return;
    }
    addActionMessage(std::move(cmd));
}